

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O3

void freeList(list *list)

{
  token *__ptr;
  
  __ptr = list->first;
  while (__ptr != (token *)0x0) {
    list->first = __ptr->next;
    free(__ptr->value);
    free(__ptr);
    __ptr = list->first;
  }
  free(list);
  return;
}

Assistant:

void freeList(struct list *list)
{
    struct token *node;

    while ((node = list->first) != NULL) {
        list->first = list->first->next;
        free(node->value);
        free(node);
    }

    free(list);
}